

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RabbitMq.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::RabbitMq::createRole
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,RabbitMq *this,Path *path,Parameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Client *client;
  string local_90;
  Path local_70;
  Url local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_90,"roles/",path);
  paVar1 = &local_70.value_.field_2;
  paVar2 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    local_70.value_.field_2._8_8_ = local_90.field_2._8_8_;
    local_70.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.value_._M_dataplus._M_p = local_90._M_dataplus._M_p;
  }
  local_70.value_.field_2._M_allocated_capacity._1_7_ = local_90.field_2._M_allocated_capacity._1_7_
  ;
  local_70.value_.field_2._M_local_buf[0] = local_90.field_2._M_local_buf[0];
  local_70.value_._M_string_length = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar2;
  getUrl(&local_50,this,&local_70);
  HttpConsumer::post(__return_storage_ptr__,client,&local_50,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value_._M_dataplus._M_p != &local_50.value_.field_2) {
    operator_delete(local_50.value_._M_dataplus._M_p,
                    local_50.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::RabbitMq::createRole(const Path &path, const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Vault::Path{"roles/" + path}),
                            parameters);
}